

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

void test_large_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  int iVar3;
  int extraout_EAX_03;
  size_t sVar4;
  undefined8 uVar5;
  Byte *compr_00;
  Byte *uncompr_00;
  char **ppcVar6;
  undefined8 *extraout_RDX;
  char *__s1;
  undefined4 uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  Byte **unaff_R12;
  uLong auStack_300 [2];
  undefined1 *puStack_2f0;
  char *pcStack_2e8;
  ulong uStack_2d8;
  undefined4 uStack_2d0;
  undefined4 uStack_2b8;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  uLong uStack_278;
  char *pcStack_268;
  undefined1 *puStack_260;
  code *pcStack_258;
  char *pcStack_250;
  int iStack_248;
  undefined1 *puStack_238;
  undefined4 uStack_230;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  uLong uStack_1f0;
  ulong uStack_1d8;
  code *pcStack_1d0;
  ulong uStack_1c0;
  uint uStack_1b8;
  undefined4 uStack_1a0;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  char *pcStack_150;
  char *pcStack_148;
  ulong uStack_140;
  code *pcStack_138;
  char *pcStack_128;
  uint uStack_120;
  ulong uStack_110;
  undefined4 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  uLong uStack_b8;
  Byte **ppBStack_b0;
  uLong uStack_a8;
  code *pcStack_a0;
  Byte *local_90;
  undefined4 local_88;
  Byte *local_78;
  undefined4 local_70;
  ulong local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  local_88 = (undefined4)comprLen;
  pcVar8 = "1.2.8";
  pcStack_a0 = (code *)0x1031c4;
  local_90 = compr;
  iVar1 = inflateInit_(&local_90,"1.2.8",0x70);
  if (iVar1 == 0) {
    unaff_R12 = &local_90;
    do {
      local_70 = (undefined4)uncomprLen;
      pcVar8 = (char *)0x0;
      pcStack_a0 = (code *)0x1031e0;
      local_78 = uncompr;
      iVar1 = inflate(unaff_R12);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      pcStack_a0 = (code *)0x103227;
      test_large_inflate_cold_4();
      goto LAB_00103227;
    }
    pcStack_a0 = (code *)0x1031f3;
    uVar2 = inflateEnd(&local_90);
    if (uVar2 != 0) goto LAB_0010322e;
    comprLen = comprLen >> 1;
    uVar12 = local_68;
    if (local_68 == comprLen + uncomprLen * 2) {
      pcStack_a0 = (code *)0x103214;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103227:
    pcStack_a0 = (code *)0x10322e;
    test_large_inflate_cold_1();
    uVar2 = extraout_EAX;
LAB_0010322e:
    uVar12 = (ulong)uVar2;
    pcStack_a0 = (code *)0x103235;
    test_large_inflate_cold_2();
  }
  pcStack_a0 = test_flush;
  test_large_inflate_cold_3();
  pcStack_138 = (code *)0x10325a;
  uStack_b8 = uncomprLen;
  ppBStack_b0 = unaff_R12;
  uStack_a8 = comprLen;
  pcStack_a0 = (code *)uncompr;
  sVar4 = strlen(hello);
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uVar9 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_138 = (code *)0x103287;
  iVar1 = deflateInit_(&pcStack_128,0xffffffff,"1.2.8");
  if (iVar1 == 0) {
    pcStack_128 = hello;
    uStack_120 = 3;
    uStack_108 = *(undefined4 *)pcVar8;
    uVar9 = 3;
    pcStack_138 = (code *)0x1032ad;
    uStack_110 = uVar12;
    iVar1 = deflate();
    if (iVar1 != 0) goto LAB_001032fa;
    *(char *)(uVar12 + 3) = *(char *)(uVar12 + 3) + '\x01';
    uStack_120 = (int)sVar4 - 2;
    sVar4 = (size_t)uStack_120;
    uVar9 = 4;
    pcStack_138 = (code *)0x1032cc;
    uVar2 = deflate();
    if (1 < uVar2) goto LAB_00103301;
    pcStack_138 = (code *)0x1032db;
    uVar2 = deflateEnd(&pcStack_128);
    if (uVar2 == 0) {
      *(undefined8 *)pcVar8 = uStack_100;
      return;
    }
  }
  else {
    pcStack_138 = (code *)0x1032fa;
    test_flush_cold_1();
LAB_001032fa:
    pcStack_138 = (code *)0x103301;
    test_flush_cold_2();
LAB_00103301:
    pcStack_138 = (code *)0x103308;
    test_flush_cold_4();
    uVar2 = extraout_EAX_00;
  }
  uVar13 = (ulong)uVar2;
  pcStack_138 = test_sync;
  test_flush_cold_3();
  pcStack_148 = hello;
  *extraout_RDX = 0x65676162726167;
  uStack_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_1b8 = 2;
  pcVar10 = "1.2.8";
  pcStack_1d0 = (code *)0x103362;
  uStack_1c0 = uVar13;
  pcStack_150 = pcVar8;
  uStack_140 = uVar12;
  pcStack_138 = (code *)sVar4;
  iVar1 = inflateInit_(&uStack_1c0,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_1a0 = SUB84(ppcVar6,0);
    pcVar10 = (char *)0x0;
    pcStack_1d0 = (code *)0x10337f;
    inflate(&uStack_1c0);
    uStack_1b8 = (int)uVar9 - 2;
    uVar9 = (ulong)uStack_1b8;
    pcStack_1d0 = (code *)0x103390;
    iVar1 = inflateSync(&uStack_1c0);
    if (iVar1 != 0) goto LAB_001033da;
    pcVar10 = (char *)0x4;
    pcStack_1d0 = (code *)0x1033a3;
    iVar1 = inflate(&uStack_1c0);
    if (iVar1 != -3) goto LAB_001033e1;
    pcStack_1d0 = (code *)0x1033b2;
    uVar2 = inflateEnd(&uStack_1c0);
    if (uVar2 == 0) {
      pcStack_1d0 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",extraout_RDX);
      return;
    }
  }
  else {
    pcStack_1d0 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_1d0 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_1d0 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar2 = extraout_EAX_01;
  }
  puVar14 = (ulong *)(ulong)uVar2;
  pcStack_1d0 = test_dict_deflate;
  test_sync_cold_4();
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uVar7 = 9;
  pcVar8 = (char *)0x70;
  pcStack_258 = (code *)0x103424;
  uStack_1d8 = uVar9;
  pcStack_1d0 = (code *)ppcVar6;
  iVar1 = deflateInit_(&pcStack_250,9,"1.2.8");
  if (iVar1 == 0) {
    uVar7 = 0x104004;
    pcStack_258 = (code *)0x10343c;
    iVar1 = deflateSetDictionary(&pcStack_250,"hello",6);
    if (iVar1 != 0) goto LAB_0010349a;
    dictId = uStack_1f0;
    uStack_230 = SUB84(pcVar10,0);
    pcStack_250 = hello;
    pcStack_258 = (code *)0x103465;
    puStack_238 = (undefined1 *)puVar14;
    sVar4 = strlen(hello);
    iStack_248 = (int)sVar4 + 1;
    uVar7 = 4;
    pcStack_258 = (code *)0x103478;
    iVar1 = deflate(&pcStack_250);
    ppcVar6 = &pcStack_250;
    if (iVar1 != 1) goto LAB_001034a1;
    pcStack_258 = (code *)0x103485;
    uVar2 = deflateEnd(&pcStack_250);
    ppcVar6 = &pcStack_250;
    if (uVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_258 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_258 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_258 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar2 = extraout_EAX_02;
  }
  uVar12 = (ulong)uVar2;
  pcStack_258 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1,"garbage",8);
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  pcVar11 = "1.2.8";
  uStack_2d8 = uVar12;
  uStack_2d0 = uVar7;
  pcStack_268 = pcVar10;
  puStack_260 = (undefined1 *)puVar14;
  pcStack_258 = (code *)ppcVar6;
  iVar1 = inflateInit_(&uStack_2d8,"1.2.8",0x70);
  if (iVar1 == 0) {
    uStack_2b8 = SUB84(pcVar8,0);
    pcVar8 = "hello";
    do {
      pcVar11 = (char *)0x0;
      iVar1 = inflate(&uStack_2d8);
      if (iVar1 == 2) {
        if (uStack_278 != dictId) {
          test_dict_inflate_cold_2();
          puVar14 = &uStack_2d8;
          goto LAB_0010358d;
        }
        pcVar11 = "hello";
        iVar1 = inflateSetDictionary(&uStack_2d8,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_0010354e:
    iVar1 = inflateEnd(&uStack_2d8);
    puVar14 = &uStack_2d8;
    if (iVar1 == 0) {
      pcVar11 = hello;
      pcVar10 = __s1;
      iVar3 = strcmp(__s1,hello);
      iVar1 = (int)pcVar10;
      puVar14 = &uStack_2d8;
      if (iVar3 == 0) {
        printf("inflate with dictionary: %s\n",__s1);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    test_dict_inflate_cold_1();
    iVar1 = extraout_EAX_03;
  }
  test_dict_inflate_cold_3();
LAB_0010359b:
  test_dict_inflate_cold_4();
  auStack_300[0] = 40000;
  puStack_2f0 = (undefined1 *)puVar14;
  pcStack_2e8 = pcVar8;
  pcVar8 = (char *)zlibVersion();
  if (*pcVar8 == '1') {
    pcVar8 = (char *)zlibVersion();
    iVar3 = strcmp(pcVar8,"1.2.8");
    if (iVar3 != 0) {
      main_cold_2();
    }
    uVar5 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar5);
    compr_00 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr_00 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr_00,40000,uncompr_00,40000);
      if (iVar1 < 2) {
        pcVar8 = "foo.gz";
      }
      else {
        pcVar8 = *(char **)(pcVar11 + 8);
      }
      test_gzio(pcVar8,uncompr_00,40000);
      test_deflate(compr_00,40000);
      test_inflate(compr_00,40000,uncompr_00,40000);
      test_large_deflate(compr_00,40000,uncompr_00,40000);
      test_large_inflate(compr_00,40000,uncompr_00,40000);
      test_flush(compr_00,auStack_300);
      test_sync(compr_00,auStack_300[0],uncompr_00,40000);
      auStack_300[0] = 40000;
      test_dict_deflate(compr_00,40000);
      test_dict_inflate(compr_00,40000,uncompr_00,40000);
      free(compr_00);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_large_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    for (;;) {
        d_stream.next_out = uncompr;            /* discard the output */
        d_stream.avail_out = (uInt)uncomprLen;
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "large inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (d_stream.total_out != 2*uncomprLen + comprLen/2) {
        fprintf(stderr, "bad large inflate: %ld\n", d_stream.total_out);
        exit(1);
    } else {
        printf("large_inflate(): OK\n");
    }
}